

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void identPut(char *z,int *pIdx,char *zSignedIdent)

{
  int iVar1;
  int iVar2;
  byte *in_RDX;
  int *in_RSI;
  long in_RDI;
  int needQuote;
  int j;
  int i;
  uchar *zIdent;
  int in_stack_ffffffffffffffcc;
  undefined3 in_stack_ffffffffffffffd0;
  uint uVar3;
  int local_28;
  int local_24;
  
  iVar1 = *in_RSI;
  for (local_28 = 0;
      (in_RDX[local_28] != 0 && (((""[in_RDX[local_28]] & 6) != 0 || (in_RDX[local_28] == 0x5f))));
      local_28 = local_28 + 1) {
  }
  uVar3 = CONCAT13(1,in_stack_ffffffffffffffd0);
  if ((""[*in_RDX] & 4) == 0) {
    iVar2 = sqlite3KeywordCode((uchar *)CONCAT44(0xaaaaaaaa,uVar3),in_stack_ffffffffffffffcc);
    uVar3 = 0x1000000;
    if ((iVar2 == 0x3c) && (uVar3 = 0x1000000, in_RDX[local_28] == 0)) {
      uVar3 = (uint)(local_28 == 0) << 0x18;
    }
  }
  local_24 = iVar1;
  if (uVar3 >> 0x18 != 0) {
    local_24 = iVar1 + 1;
    *(undefined1 *)(in_RDI + iVar1) = 0x22;
  }
  for (local_28 = 0; in_RDX[local_28] != 0; local_28 = local_28 + 1) {
    *(byte *)(in_RDI + local_24) = in_RDX[local_28];
    iVar1 = local_24 + 1;
    if (in_RDX[local_28] == 0x22) {
      *(undefined1 *)(in_RDI + (local_24 + 1)) = 0x22;
      iVar1 = local_24 + 2;
    }
    local_24 = iVar1;
  }
  if (uVar3 >> 0x18 != 0) {
    *(undefined1 *)(in_RDI + local_24) = 0x22;
    local_24 = local_24 + 1;
  }
  *(undefined1 *)(in_RDI + local_24) = 0;
  *in_RSI = local_24;
  return;
}

Assistant:

static void identPut(char *z, int *pIdx, char *zSignedIdent){
  unsigned char *zIdent = (unsigned char*)zSignedIdent;
  int i, j, needQuote;
  i = *pIdx;

  for(j=0; zIdent[j]; j++){
    if( !sqlite3Isalnum(zIdent[j]) && zIdent[j]!='_' ) break;
  }
  needQuote = sqlite3Isdigit(zIdent[0])
            || sqlite3KeywordCode(zIdent, j)!=TK_ID
            || zIdent[j]!=0
            || j==0;

  if( needQuote ) z[i++] = '"';
  for(j=0; zIdent[j]; j++){
    z[i++] = zIdent[j];
    if( zIdent[j]=='"' ) z[i++] = '"';
  }
  if( needQuote ) z[i++] = '"';
  z[i] = 0;
  *pIdx = i;
}